

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O1

JSModuleDef * js_init_module_os(JSContext *ctx,char *module_name)

{
  JSModuleDef *m;
  
  m = JS_NewCModule(ctx,module_name,js_os_init);
  if (m == (JSModuleDef *)0x0) {
    m = (JSModuleDef *)0x0;
  }
  else {
    JS_AddModuleExportList(ctx,m,js_os_funcs,0x44);
    JS_AddModuleExport(ctx,m,"Worker");
  }
  return m;
}

Assistant:

JSModuleDef *js_init_module_os(JSContext *ctx, const char *module_name)
{
    JSModuleDef *m;
    m = JS_NewCModule(ctx, module_name, js_os_init);
    if (!m)
        return NULL;
    JS_AddModuleExportList(ctx, m, js_os_funcs, countof(js_os_funcs));
#ifdef USE_WORKER
    JS_AddModuleExport(ctx, m, "Worker");
#endif
    return m;
}